

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  LogMessage *other;
  ssize_t sVar4;
  int *piVar5;
  int iVar6;
  void *__buf;
  LogMessage local_78;
  void *local_40;
  int local_38;
  LogFinisher local_31;
  
  local_40 = buffer;
  local_38 = size;
  if (this->is_closed_ == true) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0xdb);
    other = internal::LogMessage::operator<<(&local_78,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_78);
  }
  uVar3 = 0;
  do {
    uVar1 = uVar3;
    iVar2 = local_38 - uVar1;
    if (iVar2 == 0 || local_38 < (int)uVar1) break;
    __buf = (void *)((ulong)uVar1 + (long)local_40);
    do {
      sVar4 = write(this->file_,__buf,(long)iVar2);
      iVar6 = (int)sVar4;
      if (-1 < iVar6) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    if (iVar6 < 1) {
      uVar3 = uVar1;
      if (iVar6 < 0) {
        piVar5 = __errno_location();
        this->errno_ = *piVar5;
      }
    }
    else {
      uVar3 = uVar1 + iVar6;
    }
  } while (0 < iVar6);
  return local_38 <= (int)uVar1;
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(const void* buffer,
                                                      int size) {
  GOOGLE_CHECK(!is_closed_);
  int total_written = 0;

  const uint8* buffer_base = reinterpret_cast<const uint8*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}